

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O0

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  undefined1 auVar1 [8];
  uint uVar2;
  double *pdVar3;
  reference pvVar4;
  double *pdVar5;
  reference pvVar6;
  double dVar7;
  double dVar8;
  double dStack_160;
  bool discard;
  double local_158;
  double local_150;
  double local_148;
  double frag_depth;
  double w;
  double z;
  vec2f local_128;
  vec<4UL,_double> local_118;
  vec<2UL,_double> local_f8;
  vec<4UL,_double> local_e8;
  vec<2UL,_double> local_c8;
  vec<4UL,_double> local_b8;
  vec<2UL,_double> local_98;
  undefined1 local_88 [8];
  vec3f c;
  int iStack_68;
  TGAColor color;
  vec2i P;
  double local_58;
  int local_50;
  int local_4c;
  int j;
  int i;
  vec2f bboxmax;
  vec2f bboxmin;
  DepthBuffer *zbuffer_local;
  TGAImage *image_local;
  IShader *shader_local;
  Model *model_local;
  
  dVar7 = std::numeric_limits<double>::max();
  dVar8 = std::numeric_limits<double>::max();
  vec<2UL,_double>::vec((vec<2UL,_double> *)&bboxmax.y,dVar7,dVar8);
  dVar7 = std::numeric_limits<double>::max();
  dVar8 = std::numeric_limits<double>::max();
  vec<2UL,_double>::vec((vec<2UL,_double> *)&j,-dVar7,-dVar8);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
      pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&bboxmax.y,(long)local_50);
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_4c);
      pdVar5 = vec<4UL,_double>::operator[](pvVar4,(long)local_50);
      dVar7 = *pdVar5;
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_4c);
      pdVar5 = vec<4UL,_double>::operator[](pvVar4,3);
      local_58 = dVar7 / *pdVar5;
      pdVar3 = std::min<double>(pdVar3,&local_58);
      dVar7 = *pdVar3;
      pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&bboxmax.y,(long)local_50);
      *pdVar3 = dVar7;
      pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&j,(long)local_50);
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_4c);
      pdVar5 = vec<4UL,_double>::operator[](pvVar4,(long)local_50);
      dVar7 = *pdVar5;
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,(long)local_4c);
      pdVar5 = vec<4UL,_double>::operator[](pvVar4,3);
      P = (vec2i)(dVar7 / *pdVar5);
      pdVar3 = std::max<double>(pdVar3,(double *)&P);
      dVar7 = *pdVar3;
      pdVar3 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&j,(long)local_50);
      *pdVar3 = dVar7;
    }
  }
  vec<2UL,_int>::vec((vec<2UL,_int> *)&stack0xffffffffffffff98);
  TGAColor::TGAColor((TGAColor *)((long)&c.z + 3));
  for (iStack_68 = (int)bboxmax.y; iStack_68 <= (int)_j; iStack_68 = iStack_68 + 1) {
    for (color._1_4_ = (BADTYPE)bboxmin.x; (int)color._1_4_ <= (int)bboxmax.x;
        color._1_4_ = color._1_4_ + 1) {
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,0);
      pvVar6 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,0);
      pdVar3 = vec<4UL,_double>::operator[](pvVar6,3);
      operator/(&local_b8,pvVar4,pdVar3);
      local_98 = proj<2ul,4ul,double>(&local_b8);
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,1);
      pvVar6 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,1);
      pdVar3 = vec<4UL,_double>::operator[](pvVar6,3);
      operator/(&local_e8,pvVar4,pdVar3);
      local_c8 = proj<2ul,4ul,double>(&local_e8);
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,2);
      pvVar6 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,2);
      pdVar3 = vec<4UL,_double>::operator[](pvVar6,3);
      operator/(&local_118,pvVar4,pdVar3);
      local_f8 = proj<2ul,4ul,double>(&local_118);
      z = (double)proj<2ul,2ul,int>((vec<2UL,_int> *)&stack0xffffffffffffff98);
      local_128 = to_f((vec2i)z);
      barycentric((vec3f *)local_88,local_98,local_c8,local_f8,local_128);
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,0);
      pdVar3 = vec<4UL,_double>::operator[](pvVar4,2);
      auVar1 = local_88;
      dVar7 = *pdVar3;
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,1);
      pdVar3 = vec<4UL,_double>::operator[](pvVar4,2);
      dVar8 = *pdVar3 * c.x;
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,2);
      pdVar3 = vec<4UL,_double>::operator[](pvVar4,2);
      w = *pdVar3 * c.y + dVar7 * (double)auVar1 + dVar8;
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,0);
      pdVar3 = vec<4UL,_double>::operator[](pvVar4,3);
      auVar1 = local_88;
      dVar7 = *pdVar3;
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,1);
      pdVar3 = vec<4UL,_double>::operator[](pvVar4,3);
      dVar8 = *pdVar3 * c.x;
      pvVar4 = std::array<vec<4UL,_double>,_3UL>::operator[](&pts,2);
      pdVar3 = vec<4UL,_double>::operator[](pvVar4,3);
      frag_depth = *pdVar3 * c.y + dVar7 * (double)auVar1 + dVar8;
      local_150 = 0.0;
      local_158 = 255.0;
      dStack_160 = w / frag_depth + 0.5;
      pdVar3 = std::min<double>(&local_158,&stack0xfffffffffffffea0);
      pdVar3 = std::max<double>(&local_150,pdVar3);
      local_148 = *pdVar3;
      if ((((0.0 <= (double)local_88) && (0.0 <= c.x)) && (0.0 <= c.y)) &&
         ((dVar7 = DepthBuffer::get(zbuffer,(long)iStack_68,(long)(int)color._1_4_),
          dVar7 <= local_148 &&
          (uVar2 = (*shader->_vptr_IShader[3])(shader,model,(undefined1 *)((long)&c.z + 3)),
          (uVar2 & 1) == 0)))) {
        DepthBuffer::set(zbuffer,(long)iStack_68,(long)(int)color._1_4_,local_148);
        TGAImage::set(image,(long)iStack_68,(long)(int)color._1_4_,(TGAColor *)((long)&c.z + 3));
      }
    }
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f c = barycentric(proj<2, 4>(pts[0] / pts[0][3]), proj<2, 4>(pts[1] / pts[1][3]),
                                  proj<2, 4>(pts[2] / pts[2][3]), to_f(proj<2, 2>(P)));
            double z = pts[0][2] * c.x + pts[1][2] * c.y + pts[2][2] * c.z;
            double w = pts[0][3] * c.x + pts[1][3] * c.y + pts[2][3] * c.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (c.x < 0 || c.y < 0 || c.z < 0 || zbuffer.get(P.x, P.y) > frag_depth) continue;
            bool discard = shader.fragment(model, c, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}